

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

string * Appending(string *__return_storage_ptr__,string *FileName)

{
  ifstream ResultReader;
  byte abStack_200 [488];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&ResultReader,(string *)FileName,_S_in);
  while ((abStack_200[*(long *)(_ResultReader + -0x18)] & 5) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&ResultReader,(string *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::ifstream::~ifstream(&ResultReader);
  return __return_storage_ptr__;
}

Assistant:

std::string Appending(std::string FileName)
{
    std::string Results;
    std::ifstream ResultReader(FileName);
    while(ResultReader)
    {
        std::getline(ResultReader, Results);
        Results.push_back('\n');
    }
    return Results;
}